

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver_cluster.hpp
# Opt level: O0

vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
* treecut_ratio(vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                *__return_storage_ptr__,SphereTree *hierarchy,vec3f cluster_center,
               float cluster_radius,float angle_limit,float detailed_angle_limit)

{
  allocator<float> *this;
  double dVar1;
  vec3f cluster_center_00;
  initializer_list<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_> __l;
  vec3f cluster_center_01;
  vec3f cluster_center_02;
  initializer_list<Sphere> __l_00;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  float *pfVar5;
  reference pvVar6;
  vector<SphereTree,_std::allocator<SphereTree>_> *this_00;
  reference pSVar7;
  iterator __first;
  iterator __last;
  data_t dVar8;
  float fVar9;
  vec3f vVar10;
  pair<Sphere,_std::vector<float,_std::allocator<float>_>_> *local_9f0;
  __normal_iterator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_*,_std::vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>_>
  local_958;
  const_iterator local_950;
  pointer local_948;
  data_t local_940;
  pointer local_938;
  data_t local_930;
  undefined1 local_928 [8];
  vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
  cut;
  SphereTree c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<SphereTree,_std::allocator<SphereTree>_> *__range1;
  pair<Sphere,_std::vector<float,_std::allocator<float>_>_> *local_8c8;
  pair<Sphere,_std::vector<float,_std::allocator<float>_>_> local_8c0;
  iterator local_898;
  size_type local_890;
  int local_888;
  float local_884;
  int m;
  float bb;
  float bd;
  int l;
  data_t local_870;
  vector<Sphere,_std::allocator<Sphere>_> local_868;
  pointer local_850;
  data_t local_848;
  undefined1 local_844 [8];
  SH<15> fd;
  vector<Sphere,_std::allocator<Sphere>_> local_4b0;
  pointer local_498;
  data_t local_490;
  undefined1 local_488 [8];
  SH<15> fb;
  vector<float,_std::allocator<float>_> w;
  undefined1 local_c8 [8];
  vector<Sphere,_std::allocator<Sphere>_> detailed;
  allocator<Sphere> local_99;
  Sphere local_98;
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  vector<Sphere,_std::allocator<Sphere>_> bounding;
  pointer local_50;
  data_t local_48;
  float local_44;
  float local_40;
  float detailed_angle_limit_local;
  float angle_limit_local;
  float cluster_radius_local;
  SphereTree *hierarchy_local;
  data_t local_24;
  pointer local_1c;
  vec3f cluster_center_local;
  vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
  *res;
  
  local_24 = cluster_center.z;
  unique0x100001b9 = cluster_center._0_8_;
  local_44 = detailed_angle_limit;
  local_40 = angle_limit;
  detailed_angle_limit_local = cluster_radius;
  _angle_limit_local = hierarchy;
  local_1c = unique0x100001b9;
  cluster_center_local.x = local_24;
  cluster_center_local._4_8_ = __return_storage_ptr__;
  bVar2 = std::vector<SphereTree,_std::allocator<SphereTree>_>::empty(&hierarchy->child);
  bVar3 = true;
  if (!bVar2) {
    fVar9 = (_angle_limit_local->bound).radius;
    dVar1 = std::sin((double)(ulong)(uint)local_40);
    vVar10 = operator-((vec3f *)_angle_limit_local,(vec3f *)&local_1c);
    local_48 = vVar10.z;
    bounding.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = vVar10._0_8_;
    local_50 = bounding.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    dVar8 = norm((vec3f *)&local_50);
    bVar3 = fVar9 < SUB84(dVar1,0) * (dVar8 - detailed_angle_limit_local);
  }
  if (bVar3) {
    local_98.center.x = (_angle_limit_local->bound).center.x;
    local_98.center.y = (_angle_limit_local->bound).center.y;
    local_98._8_8_ = *(undefined8 *)&(_angle_limit_local->bound).center.z;
    local_88 = &local_98;
    local_80 = 1;
    std::allocator<Sphere>::allocator(&local_99);
    __l_00._M_len = local_80;
    __l_00._M_array = local_88;
    std::vector<Sphere,_std::allocator<Sphere>_>::vector
              ((vector<Sphere,_std::allocator<Sphere>_> *)local_78,__l_00,&local_99);
    std::allocator<Sphere>::~allocator(&local_99);
    cluster_center_02.z = cluster_center_local.x;
    cluster_center_02._0_8_ = local_1c;
    treecut((vector<Sphere,_std::allocator<Sphere>_> *)local_c8,_angle_limit_local,cluster_center_02
            ,detailed_angle_limit_local,local_44);
    this = (allocator<float> *)((long)fb.a + 0x37f);
    std::allocator<float>::allocator(this);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)(fb.a + 0xe0),0xf,this);
    std::allocator<float>::~allocator((allocator<float> *)((long)fb.a + 0x37f));
    local_490 = cluster_center_local.x;
    local_498 = local_1c;
    std::vector<Sphere,_std::allocator<Sphere>_>::vector
              (&local_4b0,(vector<Sphere,_std::allocator<Sphere>_> *)local_78);
    fd.a._892_8_ = local_498;
    cluster_center_01.z = local_490;
    cluster_center_01._0_8_ = local_498;
    log_visibility((SH<15> *)local_488,cluster_center_01,&local_4b0);
    std::vector<Sphere,_std::allocator<Sphere>_>::~vector(&local_4b0);
    local_848 = cluster_center_local.x;
    local_850 = local_1c;
    std::vector<Sphere,_std::allocator<Sphere>_>::vector
              (&local_868,(vector<Sphere,_std::allocator<Sphere>_> *)local_c8);
    local_870 = local_848;
    _bd = local_850;
    vVar10.z = local_848;
    vVar10._0_8_ = local_850;
    log_visibility((SH<15> *)local_844,vVar10,&local_868);
    std::vector<Sphere,_std::allocator<Sphere>_>::~vector(&local_868);
    for (bb = 0.0; (int)bb < 0xf; bb = (float)((int)bb + 1)) {
      m = 0;
      local_884 = 0.0;
      for (local_888 = -(int)bb; local_888 <= (int)bb; local_888 = local_888 + 1) {
        pfVar5 = SH<15>::at((SH<15> *)local_488,(int)bb,local_888);
        fVar9 = *pfVar5;
        pfVar5 = SH<15>::at((SH<15> *)local_844,(int)bb,local_888);
        m = (int)(fVar9 * *pfVar5 + (float)m);
        pfVar5 = SH<15>::at((SH<15> *)local_488,(int)bb,local_888);
        fVar9 = *pfVar5;
        pfVar5 = SH<15>::at((SH<15> *)local_488,(int)bb,local_888);
        local_884 = fVar9 * *pfVar5 + local_884;
      }
      fVar9 = (float)m / local_884;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(fb.a + 0xe0),(long)(int)bb);
      *pvVar6 = fVar9;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(fb.a + 0xe0),(long)(int)bb);
      uVar4 = std::isnan((double)(ulong)(uint)*pvVar6);
      if ((uVar4 & 1) != 0) {
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(fb.a + 0xe0),(long)(int)bb);
        *pvVar6 = 1.0;
      }
    }
    local_8c8 = &local_8c0;
    std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>::
    pair<std::vector<float,_std::allocator<float>_>_&,_true>
              (local_8c8,&_angle_limit_local->bound,
               (vector<float,_std::allocator<float>_> *)(fb.a + 0xe0));
    local_898 = &local_8c0;
    local_890 = 1;
    std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>::allocator
              ((allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_> *)
               ((long)&__range1 + 7));
    __l._M_len = local_890;
    __l._M_array = local_898;
    std::
    vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::vector(__return_storage_ptr__,__l,
             (allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_> *)
             ((long)&__range1 + 7));
    std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>::~allocator
              ((allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_> *)
               ((long)&__range1 + 7));
    local_9f0 = (pair<Sphere,_std::vector<float,_std::allocator<float>_>_> *)&local_898;
    do {
      local_9f0 = local_9f0 + -1;
      std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>::~pair(local_9f0);
    } while (local_9f0 != &local_8c0);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)(fb.a + 0xe0));
    std::vector<Sphere,_std::allocator<Sphere>_>::~vector
              ((vector<Sphere,_std::allocator<Sphere>_> *)local_c8);
    std::vector<Sphere,_std::allocator<Sphere>_>::~vector
              ((vector<Sphere,_std::allocator<Sphere>_> *)local_78);
  }
  else {
    __range1._6_1_ = 0;
    std::
    vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::vector(__return_storage_ptr__);
    this_00 = &_angle_limit_local->child;
    __end1 = std::vector<SphereTree,_std::allocator<SphereTree>_>::begin(this_00);
    c.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<SphereTree,_std::allocator<SphereTree>_>::end(this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                                       *)&c.child.
                                          super__Vector_base<SphereTree,_std::allocator<SphereTree>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar3
          ) {
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
               ::operator*(&__end1);
      SphereTree::SphereTree
                ((SphereTree *)
                 &cut.
                  super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,pSVar7);
      local_930 = cluster_center_local.x;
      local_938 = local_1c;
      local_940 = cluster_center_local.x;
      local_948 = local_1c;
      cluster_center_00.z = cluster_center_local.x;
      cluster_center_00._0_8_ = local_1c;
      treecut_ratio((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                     *)local_928,
                    (SphereTree *)
                    &cut.
                     super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,cluster_center_00,
                    detailed_angle_limit_local,local_40,local_44);
      local_958._M_current =
           (pair<Sphere,_std::vector<float,_std::allocator<float>_>_> *)
           std::
           vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
           ::end(__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<std::pair<Sphere,std::vector<float,std::allocator<float>>>const*,std::vector<std::pair<Sphere,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<Sphere,std::vector<float,std::allocator<float>>>>>>
      ::__normal_iterator<std::pair<Sphere,std::vector<float,std::allocator<float>>>*>
                ((__normal_iterator<std::pair<Sphere,std::vector<float,std::allocator<float>>>const*,std::vector<std::pair<Sphere,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<Sphere,std::vector<float,std::allocator<float>>>>>>
                  *)&local_950,&local_958);
      __first = std::
                vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::begin((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                         *)local_928);
      __last = std::
               vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::end((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                      *)local_928);
      std::
      vector<std::pair<Sphere,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<Sphere,std::vector<float,std::allocator<float>>>>>
      ::
      insert<__gnu_cxx::__normal_iterator<std::pair<Sphere,std::vector<float,std::allocator<float>>>*,std::vector<std::pair<Sphere,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<Sphere,std::vector<float,std::allocator<float>>>>>>,void>
                ((vector<std::pair<Sphere,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<Sphere,std::vector<float,std::allocator<float>>>>>
                  *)__return_storage_ptr__,local_950,
                 (__normal_iterator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_*,_std::vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_*,_std::vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>_>
                  )__last._M_current);
      std::
      vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
      ::~vector((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                 *)local_928);
      SphereTree::~SphereTree
                ((SphereTree *)
                 &cut.
                  super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<const_SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>::
      operator++(&__end1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<Sphere, std::vector<float>>> treecut_ratio(const SphereTree& hierarchy, vec3f cluster_center, float cluster_radius, float angle_limit, float detailed_angle_limit)
{
	// stop recursing if the blockersphere subtends an angle less than angle_limit
	if (hierarchy.child.empty() || hierarchy.bound.radius < sin(angle_limit) * (norm(hierarchy.bound.center - cluster_center) - cluster_radius))
	{
		std::vector<Sphere> bounding = {hierarchy.bound};
		std::vector<Sphere> detailed = treecut(hierarchy, cluster_center, cluster_radius, detailed_angle_limit);
		std::vector<float> w(shorder);
		SH<shorder> fb = log_visibility(cluster_center, bounding);
		SH<shorder> fd = log_visibility(cluster_center, detailed);
		for (int l=0; l<shorder; ++l) {
			float bd=0, bb=0;
			for (int m=-l; m<=l; ++m) {
				bd += fb.at(l,m) * fd.at(l,m);
				bb += fb.at(l,m) * fb.at(l,m);
			}
			w[l] = bd / bb;
			// replace nan with 1
			if (std::isnan(w[l]))
				w[l] = 1.0f;
		}
		return {{hierarchy.bound, w}};
	}
	std::vector<std::pair<Sphere, std::vector<float>>> res;
	for (auto c: hierarchy.child)
	{
		auto cut = treecut_ratio(c, cluster_center, cluster_radius, angle_limit, detailed_angle_limit);
		res.insert(res.end(), cut.begin(), cut.end());
	}
	return res;
}